

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool OverlapBoundedPlaneXYZHelper(double *a_bounded_plane,ON_RTreeBBox *a_rect)

{
  double dVar1;
  byte bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar4 = a_rect->m_min[0] * *a_bounded_plane;
  dVar6 = a_rect->m_min[1] * a_bounded_plane[1];
  dVar5 = a_rect->m_min[2] * a_bounded_plane[2];
  dVar3 = a_bounded_plane[3];
  dVar7 = dVar4 + dVar6;
  dVar8 = dVar7 + dVar5 + dVar3;
  dVar1 = a_bounded_plane[4];
  bVar2 = 1;
  if ((dVar8 < dVar1) || (bVar2 = 2, a_bounded_plane[5] <= dVar8 && dVar8 != a_bounded_plane[5])) {
    dVar8 = *a_bounded_plane * a_rect->m_max[0];
    dVar6 = dVar6 + dVar8;
    dVar9 = dVar5 + dVar6 + dVar3;
    if (dVar1 <= dVar9) {
      bVar2 = bVar2 | 2;
      if (bVar2 == 3) {
        return true;
      }
      if (dVar9 < a_bounded_plane[5] || dVar9 == a_bounded_plane[5]) {
        return true;
      }
    }
    else {
      bVar2 = bVar2 | 1;
      if (bVar2 == 3) {
        return true;
      }
    }
    dVar9 = a_bounded_plane[1] * a_rect->m_max[1];
    dVar8 = dVar8 + dVar9;
    dVar10 = dVar5 + dVar8 + dVar3;
    if (dVar1 <= dVar10) {
      bVar2 = bVar2 | 2;
      if (bVar2 == 3) {
        return true;
      }
      if (dVar10 < a_bounded_plane[5] || dVar10 == a_bounded_plane[5]) {
        return true;
      }
    }
    else {
      bVar2 = bVar2 | 1;
      if (bVar2 == 3) {
        return true;
      }
    }
    dVar10 = a_bounded_plane[2] * a_rect->m_max[2];
    dVar8 = dVar8 + dVar10 + dVar3;
    if (dVar1 <= dVar8) {
      bVar2 = bVar2 | 2;
      if (bVar2 == 3) {
        return true;
      }
      if (dVar8 < a_bounded_plane[5] || dVar8 == a_bounded_plane[5]) {
        return true;
      }
    }
    else {
      bVar2 = bVar2 | 1;
      if (bVar2 == 3) {
        return true;
      }
    }
    dVar4 = dVar4 + dVar9;
    dVar8 = dVar4 + dVar10 + dVar3;
    if (dVar1 <= dVar8) {
      bVar2 = bVar2 | 2;
      if (bVar2 == 3) {
        return true;
      }
      if (dVar8 < a_bounded_plane[5] || dVar8 == a_bounded_plane[5]) {
        return true;
      }
    }
    else {
      bVar2 = bVar2 | 1;
      if (bVar2 == 3) {
        return true;
      }
    }
    dVar7 = dVar7 + dVar10 + dVar3;
    if (dVar1 <= dVar7) {
      bVar2 = bVar2 | 2;
      if (bVar2 == 3) {
        return true;
      }
      if (dVar7 < a_bounded_plane[5] || dVar7 == a_bounded_plane[5]) {
        return true;
      }
    }
    else {
      bVar2 = bVar2 | 1;
      if (bVar2 == 3) {
        return true;
      }
    }
    dVar6 = dVar6 + dVar10 + dVar3;
    if (dVar1 <= dVar6) {
      bVar2 = bVar2 | 2;
      if (bVar2 == 3) {
        return true;
      }
      if (dVar6 < a_bounded_plane[5] || dVar6 == a_bounded_plane[5]) {
        return true;
      }
    }
    else {
      bVar2 = bVar2 | 1;
      if (bVar2 == 3) {
        return true;
      }
    }
    dVar3 = dVar3 + dVar5 + dVar4;
    if (dVar1 <= dVar3) {
      if (((bVar2 & 1) == 0) && (a_bounded_plane[5] <= dVar3 && dVar3 != a_bounded_plane[5])) {
        return false;
      }
    }
    else if ((bVar2 & 2) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

static
bool OverlapBoundedPlaneXYZHelper( const double* a_bounded_plane, const ON_RTreeBBox* a_rect )
{
  unsigned char flag = 0;
  double x, y, z, d, v;
  
  // check the 8 corners of the box minimizing the number of evaluations
  // and unrolling the loop for speed

  // corner = (min, min, min)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  y = a_bounded_plane[1]*a_rect->m_min[1];
  z = a_bounded_plane[2]*a_rect->m_min[2];
  d = a_bounded_plane[3];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
    flag = 1;
  else if ( v > a_bounded_plane[5] )
    flag = 2;
  else
    return true;
  
  // corner = (max, min, min)
  x = a_bounded_plane[0]*a_rect->m_max[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // corner = (max, max, min)
  y = a_bounded_plane[1]*a_rect->m_max[1];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
    
  // corner = (max, max, max)
  z = a_bounded_plane[2]*a_rect->m_max[2];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (min, max, max)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // corner = (min, min, max)
  y = a_bounded_plane[1]*a_rect->m_min[1];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (max, min, max)
  x = a_bounded_plane[0]*a_rect->m_max[0]; 
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;

  // corner = (min, max, min)
  x = a_bounded_plane[0]*a_rect->m_min[0]; 
  y = a_bounded_plane[1]*a_rect->m_max[1];
  z = a_bounded_plane[2]*a_rect->m_min[2];
  v = x + y + z + d;
  if ( v < a_bounded_plane[4] )
  {
    flag |= 1;
    if ( 3 == flag )
      return true;
  }
  else if ( v > a_bounded_plane[5] )
  {
    flag |= 2;
    if ( 3 == flag )
      return true;
  }
  else
    return true;
  
  // Either all 8 box corners 
  // are below the min plane (flag=1)
  // or above the max plane (flag=2).
  return false;
}